

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

OnCallSpec<void_()> * __thiscall
testing::internal::FunctionMocker<void_()>::FindOnCallSpec
          (FunctionMocker<void_()> *this,ArgumentTuple *args)

{
  OnCallSpec<void_()> *pOVar1;
  long *plVar2;
  char cVar3;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  __tmp;
  pointer ppvVar4;
  undefined **local_40;
  undefined8 local_38;
  
  ppvVar4 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppvVar4 ==
        (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
        super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      return (OnCallSpec<void_()> *)0x0;
    }
    pOVar1 = (OnCallSpec<void_()> *)ppvVar4[-1];
    ppvVar4 = ppvVar4 + -1;
    local_38 = 0;
    local_40 = &PTR__MatchResultListener_0039fb90;
    plVar2 = *(long **)(pOVar1 + 0x20);
    cVar3 = (**(code **)(*plVar2 + 0x20))(plVar2,args,&local_40);
  } while (cVar3 == '\0');
  return pOVar1;
}

Assistant:

const OnCallSpec<F>* FindOnCallSpec(
      const ArgumentTuple& args) const {
    for (UntypedOnCallSpecs::const_reverse_iterator it
             = untyped_on_call_specs_.rbegin();
         it != untyped_on_call_specs_.rend(); ++it) {
      const OnCallSpec<F>* spec = static_cast<const OnCallSpec<F>*>(*it);
      if (spec->Matches(args))
        return spec;
    }

    return nullptr;
  }